

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

value loader_impl_metadata(loader_impl impl)

{
  undefined8 uVar1;
  long in_RDI;
  value v;
  loader_impl_metadata_cb_iterator_type metadata_iterator;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  value local_8;
  
  local_10 = in_RDI;
  uVar1 = set_size(*(undefined8 *)(in_RDI + 0x10));
  local_8 = (value)value_create_array(0,uVar1);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    local_20 = 0;
    local_18 = value_to_array(local_8);
    set_iterate(*(undefined8 *)(local_10 + 0x10),loader_impl_metadata_cb_iterate,&local_20);
  }
  return local_8;
}

Assistant:

value loader_impl_metadata(loader_impl impl)
{
	struct loader_impl_metadata_cb_iterator_type metadata_iterator;

	value v = value_create_array(NULL, set_size(impl->handle_impl_path_map));

	if (v == NULL)
	{
		return NULL;
	}

	metadata_iterator.iterator = 0;
	metadata_iterator.values = value_to_array(v);

	set_iterate(impl->handle_impl_path_map, &loader_impl_metadata_cb_iterate, (set_cb_iterate_args)&metadata_iterator);

	return v;
}